

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

TSymbol * __thiscall glslang::TSymbolTable::copyUpDeferredInsert(TSymbolTable *this,TSymbol *shared)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar2;
  undefined8 *puVar3;
  TSymbol *pTVar4;
  TString *pTVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_01;
  
  iVar1 = (*shared->_vptr_TSymbol[9])(shared);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*shared->_vptr_TSymbol[0xb])(shared);
    plVar2 = (long *)CONCAT44(extraout_var_01,iVar1);
    if (plVar2 == (long *)0x0) {
      __assert_fail("anon",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                    ,0x2f9,"TSymbol *glslang::TSymbolTable::copyUpDeferredInsert(TSymbol *)");
    }
    puVar3 = (undefined8 *)(**(code **)(*plVar2 + 0xb0))(plVar2);
    pTVar4 = (TSymbol *)(**(code **)*puVar3)(puVar3);
    pTVar5 = NewPoolTString_abi_cxx11_("");
    (*pTVar4->_vptr_TSymbol[4])(pTVar4,pTVar5);
    shared = (TSymbol *)(**(code **)(*plVar2 + 0xb0))(plVar2);
  }
  else {
    iVar1 = (**shared->_vptr_TSymbol)(shared);
    pTVar4 = (TSymbol *)CONCAT44(extraout_var_00,iVar1);
  }
  iVar1 = (*shared->_vptr_TSymbol[0xf])(shared);
  (*pTVar4->_vptr_TSymbol[0xe])(pTVar4,CONCAT44(extraout_var_02,iVar1));
  return pTVar4;
}

Assistant:

TSymbol* copyUpDeferredInsert(TSymbol* shared)
    {
        if (shared->getAsVariable()) {
            TSymbol* copy = shared->clone();
            copy->setUniqueId(shared->getUniqueId());
            return copy;
        } else {
            const TAnonMember* anon = shared->getAsAnonMember();
            assert(anon);
            TVariable* container = anon->getAnonContainer().clone();
            container->changeName(NewPoolTString(""));
            container->setUniqueId(anon->getAnonContainer().getUniqueId());
            return container;
        }
    }